

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

WithinUlpsMatcher *
Catch::Matchers::WithinULP
          (WithinUlpsMatcher *__return_storage_ptr__,double target,uint64_t maxUlpDiff)

{
  uint64_t maxUlpDiff_local;
  double target_local;
  
  WithinUlpsMatcher::WithinUlpsMatcher(__return_storage_ptr__,target,maxUlpDiff,Double);
  return __return_storage_ptr__;
}

Assistant:

WithinUlpsMatcher WithinULP(double target, uint64_t maxUlpDiff) {
            return WithinUlpsMatcher(target, maxUlpDiff, Detail::FloatingPointKind::Double);
        }